

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int properties_get_message_id(PROPERTIES_HANDLE properties,AMQP_VALUE *message_id_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  PROPERTIES_INSTANCE *properties_instance;
  uint32_t item_count;
  int result;
  AMQP_VALUE *message_id_value_local;
  PROPERTIES_HANDLE properties_local;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    properties_instance._4_4_ = 0x3e9d;
  }
  else {
    _item_count = message_id_value;
    message_id_value_local = &properties->composite_value;
    iVar1 = amqpvalue_get_composite_item_count
                      (properties->composite_value,(uint32_t *)&properties_instance);
    if (iVar1 == 0) {
      if ((int)properties_instance == 0) {
        properties_instance._4_4_ = 0x3eab;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(properties->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          properties_instance._4_4_ = 0x3eb3;
        }
        else {
          *_item_count = value;
          properties_instance._4_4_ = 0;
        }
      }
    }
    else {
      properties_instance._4_4_ = 0x3ea5;
    }
  }
  return properties_instance._4_4_;
}

Assistant:

int properties_get_message_id(PROPERTIES_HANDLE properties, AMQP_VALUE* message_id_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        if (amqpvalue_get_composite_item_count(properties_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(properties_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *message_id_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}